

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Utils.cpp
# Opt level: O3

int Utils::getCountOfBytesBeforeNullTerminatorInt(const_iterator it)

{
  uint *puVar1;
  long lVar2;
  const_iterator itCopy;
  
  if (*it._M_current != 0) {
    lVar2 = 1;
    do {
      puVar1 = it._M_current + lVar2;
      lVar2 = lVar2 + 1;
    } while (*puVar1 != 0);
    return (int)lVar2 + 1;
  }
  return 3;
}

Assistant:

int Utils::getCountOfBytesBeforeNullTerminatorInt(std::vector<unsigned int>::const_iterator it) {
    int countBytesBeforeNullTerminated = 0;
    auto itCopy = it;
    // Получаем сколько байт нужно считать до нультермитатора
    while ((int)*itCopy != 0x00 && (int)*(itCopy + 1) != 0x00 ) {
        ++countBytesBeforeNullTerminated;
        ++itCopy;
    }
    return countBytesBeforeNullTerminated + 3;
}